

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

Value * minja::Value::callable(Value *__return_storage_ptr__,CallableType *callable)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::
  make_shared<std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)>,std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)>const&>
            ((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>
              *)&stack0xffffffffffffffe0);
  Value(__return_storage_ptr__,
        (shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>_>
         *)&stack0xffffffffffffffe0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return __return_storage_ptr__;
}

Assistant:

static Value callable(const CallableType & callable) {
    return Value(std::make_shared<CallableType>(callable));
  }